

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O1

bool run_test_type_conversion<std::reference_wrapper<unsigned_char_const>const>
               (Boxed_Value *bv,bool expectedpass)

{
  chaiscript::boxed_cast<std::reference_wrapper<unsigned_char_const>const>
            (bv,(Type_Conversions_State *)0x0);
  return expectedpass;
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}